

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.hpp
# Opt level: O0

size_t __thiscall webfront::fs::File::readData(File *this,span<char,_18446744073709551615UL> buffer)

{
  bool bVar1;
  size_type sVar2;
  uint8_t *puVar3;
  File *in_RDI;
  size_t index;
  UIntByte chunk;
  unsigned_long bytesPerInt;
  undefined7 in_stack_ffffffffffffffa8;
  uint8_t in_stack_ffffffffffffffaf;
  ulong local_38;
  UIntByte local_30;
  undefined8 local_28;
  span<char,_18446744073709551615UL> local_18;
  
  local_28 = 8;
  memset(&local_30,0,8);
  local_38 = 0;
  while( true ) {
    sVar2 = http::std::span<char,_18446744073709551615UL>::size
                      ((span<char,_18446744073709551615UL> *)0x12f114);
    if (sVar2 <= local_38) {
      sVar2 = http::std::span<char,_18446744073709551615UL>::size
                        ((span<char,_18446744073709551615UL> *)0x12f1f4);
      return sVar2;
    }
    bVar1 = eof(in_RDI);
    if (bVar1) break;
    if ((in_RDI->readIndex & 7) == 0) {
      http::std::span<const_unsigned_long,_18446744073709551615UL>::operator[]
                (&in_RDI->data,in_RDI->readIndex >> 3);
      local_30 = convert(CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
    }
    in_stack_ffffffffffffffaf = local_30.byte[in_RDI->readIndex & 7];
    puVar3 = (uint8_t *)
             http::std::span<char,_18446744073709551615UL>::operator[](&local_18,local_38);
    *puVar3 = in_stack_ffffffffffffffaf;
    in_RDI->readIndex = in_RDI->readIndex + 1;
    if (in_RDI->readIndex == in_RDI->size) {
      in_RDI->eofBit = true;
    }
    local_38 = local_38 + 1;
  }
  return local_38;
}

Assistant:

size_t readData(std::span<char> buffer) {
        constexpr auto bytesPerInt = sizeof(decltype(data)::value_type);
        UIntByte chunk{};
        for (size_t index = 0; (index < buffer.size()); ++index) {
            if (eof()) return index;

            if (readIndex % bytesPerInt == 0) chunk = convert(data[readIndex / bytesPerInt]);

            buffer[index] = static_cast<char>(chunk.byte[readIndex % bytesPerInt]);
            readIndex++;
            if (readIndex == size) eofBit = true;
        }
        return buffer.size();
    }